

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O1

void __thiscall Hydro::MacProjector::project(MacProjector *this,Real reltol,Real atol)

{
  pointer paVar1;
  FabArray<amrex::FArrayBox> *this_00;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> vel_eb;
  pointer pMVar2;
  MLMG *pMVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *in_RDX;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *extraout_RDX;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *extraout_RDX_00;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *extraout_RDX_01;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a;
  MultiFab *pMVar7;
  long lVar8;
  int idim;
  long lVar9;
  ulong uVar10;
  long lVar11;
  Real RVar12;
  Array<const_MultiFab_*,_3> u;
  Array<const_MultiFab_*,_3> local_80;
  ulong local_68;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> local_60;
  Real local_48;
  Real local_40;
  amrex *local_38;
  
  uVar5 = (int)((long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_start >> 7) * -0x55555555;
  local_48 = reltol;
  local_40 = atol;
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      if ((this->m_needs_level_bcs).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar10] != 0) {
        (*this->m_linop->_vptr_MLLinOp[3])(this->m_linop,uVar10 & 0xffffffff,0,0,0);
        (this->m_needs_level_bcs).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar10] = 0;
        in_RDX = extraout_RDX;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar10);
  }
  if (((this->m_umac).
       super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       .
       super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0] != (MultiFab *)0x0) {
    averageDownVelocity(this);
    in_RDX = extraout_RDX_00;
  }
  local_38 = (amrex *)&this->m_rhs;
  if (0 < (int)uVar5) {
    local_68 = (ulong)(uVar5 & 0x7fffffff);
    lVar8 = 0;
    uVar10 = 0;
    do {
      paVar1 = (this->m_umac).
               super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (paVar1->_M_elems[0] != (MultiFab *)0x0) {
        lVar6 = 0;
        do {
          local_80._M_elems[lVar6] = *(MultiFab **)((long)paVar1->_M_elems + lVar6 * 8 + lVar8);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        if (this->m_umac_loc != FaceCentroid) {
          lVar11 = 3;
          lVar6 = lVar8;
          do {
            if (*(int *)(*(long *)((long)((this->m_umac).
                                          super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                                          .
                                          super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                  lVar6) + 0xc0) < 1) {
              amrex::Assert_host("m_umac[ilev][idim]->nGrow() > 0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_MacProjector.cpp"
                                 ,0xf6,
                                 "\"MacProjector: with EB, umac must have at least one ghost cell if not already_on_centroid\""
                                );
            }
            this_00 = *(FabArray<amrex::FArrayBox> **)
                       ((long)((this->m_umac).
                               super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                               .
                               super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6);
            local_60.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
            .super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
            _M_impl.super__Vector_impl_data._0_12_ =
                 amrex::Geometry::periodicity
                           ((this->m_geom).
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar10);
            amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                      (this_00,(Periodicity *)&local_60,false);
            lVar6 = lVar6 + 8;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        vel_eb.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
              &(this->m_eb_vel).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        pMVar7 = (this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                 super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar10;
        if (vel_eb.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl ==
            (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
          amrex::EB_computeDivergence
                    (pMVar7,&local_80,
                     (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar10,this->m_umac_loc == FaceCentroid);
        }
        else {
          amrex::EB_computeDivergence
                    (pMVar7,&local_80,
                     (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar10,this->m_umac_loc == FaceCentroid,
                     (MultiFab *)
                     vel_eb.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
        }
        RVar12 = -1.0;
        if ((this->m_poisson)._M_t.
            super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
            super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl != (MLPoisson *)0x0) {
          RVar12 = 1.0 / this->m_const_beta;
        }
        amrex::MultiFab::mult
                  ((this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10,RVar12,0);
      }
      bVar4 = amrex::FabArray<amrex::FArrayBox>::ok
                        (&(this->m_divu).
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10].
                          super_FabArray<amrex::FArrayBox>);
      if (bVar4) {
        RVar12 = 1.0;
        if ((this->m_poisson)._M_t.
            super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
            super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl != (MLPoisson *)0x0) {
          RVar12 = -1.0 / this->m_const_beta;
        }
        amrex::MultiFab::Saxpy
                  ((this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10,RVar12,
                   (this->m_divu).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10,0,0,1,0);
      }
      pMVar2 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&pMVar2[uVar10].super_FabArray<amrex::FArrayBox>,0.0,0,
                 pMVar2[uVar10].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
                 &pMVar2[uVar10].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x18;
      in_RDX = extraout_RDX_01;
    } while (uVar10 != local_68);
  }
  pMVar3 = (this->m_mlmg)._M_t.super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>
           ._M_t.super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
           super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl;
  amrex::GetVecOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_80,
             (amrex *)&this->m_phi,in_RDX);
  amrex::GetVecOfConstPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            (&local_60,local_38,a);
  amrex::MLMG::solve(pMVar3,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            &local_80,&local_60,local_48,local_40,(char *)0x0);
  if (local_60.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          .
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          .
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80._M_elems[0] != (MultiFab *)0x0) {
    operator_delete(local_80._M_elems[0],(long)local_80._M_elems[2] - (long)local_80._M_elems[0]);
  }
  if (((this->m_umac).
       super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       .
       super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0] != (MultiFab *)0x0) {
    pMVar3 = (this->m_mlmg)._M_t.
             super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
             super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl;
    amrex::GetVecOfArrOfPtrs<amrex::MultiFab,_0>
              ((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)&local_80,&this->m_fluxes);
    amrex::MLMG::getFluxes
              (pMVar3,(Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                       *)&local_80,this->m_umac_loc);
    if (local_80._M_elems[0] != (MultiFab *)0x0) {
      operator_delete(local_80._M_elems[0],(long)local_80._M_elems[2] - (long)local_80._M_elems[0]);
    }
    if (0 < (int)uVar5) {
      lVar6 = 0;
      lVar8 = 0;
      uVar10 = 0;
      do {
        lVar9 = 0;
        lVar11 = lVar6;
        local_68 = uVar10;
        do {
          pMVar7 = *(MultiFab **)
                    ((long)((this->m_umac).
                            super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9 * 8 + lVar8
                    );
          if ((this->m_poisson)._M_t.
              super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
              super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl == (MLPoisson *)0x0) {
            amrex::MultiFab::Add
                      (pMVar7,(MultiFab *)
                              ((long)&((this->m_fluxes).
                                       super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                       .
                                       super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                                      super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                      _vptr_FabArrayBase + lVar11),0,0,1,0);
          }
          else {
            amrex::MultiFab::Saxpy
                      (pMVar7,this->m_const_beta,
                       (MultiFab *)
                       ((long)&((this->m_fluxes).
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                               super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                               _vptr_FabArrayBase + lVar11),0,0,1,0);
          }
          amrex::EB_set_covered_faces
                    ((this->m_umac).
                     super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar10,0.0);
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + 0x180;
        } while (lVar9 != 3);
        uVar10 = local_68 + 1;
        lVar8 = lVar8 + 0x18;
        lVar6 = lVar6 + 0x480;
      } while (uVar10 != (uVar5 & 0x7fffffff));
    }
    averageDownVelocity(this);
  }
  return;
}

Assistant:

void
MacProjector::project (Real reltol, Real atol)
{
    const int nlevs = m_rhs.size();

    for (int ilev = 0; ilev < nlevs; ++ilev) {
        if (m_needs_level_bcs[ilev]) {
            m_linop->setLevelBC(ilev, nullptr);
            m_needs_level_bcs[ilev] = false;
        }
    }

    if ( m_umac[0][0] )
      averageDownVelocity();

    for (int ilev = 0; ilev < nlevs; ++ilev)
    {
      if ( m_umac[0][0] )
      {
        Array<MultiFab const*, AMREX_SPACEDIM> u;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            u[idim] = m_umac[ilev][idim];
        }
#ifdef AMREX_USE_EB
        if (m_umac_loc != MLMG::Location::FaceCentroid)
        {
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_umac[ilev][idim]->nGrow() > 0,
                                                 "MacProjector: with EB, umac must have at least one ghost cell if not already_on_centroid");
                m_umac[ilev][idim]->FillBoundary(m_geom[ilev].periodicity());
            }
        }

        if (m_eb_vel[ilev]) {
           EB_computeDivergence(m_rhs[ilev], u, m_geom[ilev], (m_umac_loc == MLMG::Location::FaceCentroid), *m_eb_vel[ilev]);
        } else {
           EB_computeDivergence(m_rhs[ilev], u, m_geom[ilev], (m_umac_loc == MLMG::Location::FaceCentroid));
        }
#else
        computeDivergence(m_rhs[ilev], u, m_geom[ilev]);
#endif

        // For mlabeclaplacian, we solve -del dot (beta grad phi) = rhs
        //   and set up RHS as (m_divu - divu), where m_divu is a user-provided source term
        // For mlpoisson, we solve `del dot grad phi = rhs/(-const_beta)`
        //   and set up RHS as (m_divu - divu)*(-1/const_beta)
        AMREX_ASSERT(m_poisson == nullptr || m_const_beta != Real(0.0));
        m_rhs[ilev].mult(m_poisson ? Real(1.0)/m_const_beta : Real(-1.0));
      }
      //else m_rhs already initialized to 0

      if (m_divu[ilev].ok())
      {
        MultiFab::Saxpy(m_rhs[ilev], m_poisson ? Real(-1.0)/m_const_beta : Real(1.0),
                        m_divu[ilev], 0, 0, 1, 0);
      }

      // Always reset initial phi to be zero. This is needed to handle the
      // situation where the MacProjector is being reused.
      m_phi[ilev].setVal(0.0);
    }

    m_mlmg->solve(amrex::GetVecOfPtrs(m_phi), amrex::GetVecOfConstPtrs(m_rhs), reltol, atol);

    if ( m_umac[0][0] )
    {
      m_mlmg->getFluxes(amrex::GetVecOfArrOfPtrs(m_fluxes), m_umac_loc);

      for (int ilev = 0; ilev < nlevs; ++ilev) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (m_poisson) {
                MultiFab::Saxpy(*m_umac[ilev][idim], m_const_beta, m_fluxes[ilev][idim], 0,0,1,0);
            } else {
                MultiFab::Add(*m_umac[ilev][idim], m_fluxes[ilev][idim], 0, 0, 1, 0);
            }
#ifdef AMREX_USE_EB
            EB_set_covered_faces(m_umac[ilev], 0.0);
#endif
        }
      }

      averageDownVelocity();
    }

}